

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O3

int lyb_parse_schema_hash
              (lys_node *sparent,lys_module *mod,char *data,char *yang_data_name,int options,
              lys_node **snode,lyb_state *lybs)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  lys_node *last;
  lys_node *sibling;
  ulong uVar5;
  LY_VLOG_ELEM elem_type;
  byte bVar6;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  uint uVar12;
  lys_node *plVar13;
  byte local_47 [7];
  lys_module *plStack_40;
  uint8_t hash [7];
  ulong uVar7;
  
  if ((sparent == (lys_node *)0x0) != (mod != (lys_module *)0x0)) {
    __assert_fail("(sparent || mod) && (!sparent || !mod)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                  ,0x38a,
                  "int lyb_parse_schema_hash(const struct lys_node *, const struct lys_module *, const char *, const char *, int, struct lys_node **, struct lyb_state *)"
                 );
  }
  uVar1 = lyb_read(data,local_47,1,lybs);
  if ((int)uVar1 < 0) {
    return -1;
  }
  if ((char)local_47[0] < '\0') {
    lVar11 = 1;
  }
  else {
    pcVar9 = data + uVar1;
    uVar7 = 0;
    do {
      uVar5 = uVar7;
      if ((int)uVar5 == 9) {
        return -1;
      }
      uVar7 = uVar5 + 1;
    } while (((uint)local_47[0] << ((byte)uVar5 & 0x1f) & 0x40) == 0);
    plStack_40 = mod;
    local_47[uVar5 + 1] = local_47[0];
    uVar7 = uVar5 + 1 & 0xffffffff;
    do {
      uVar12 = ((uint)uVar7 & 0xff) - 1;
      uVar2 = lyb_read(pcVar9,local_47 + uVar12,1,lybs);
      if ((int)uVar2 < 0) {
        return -1;
      }
      bVar6 = local_47[uVar12];
      if (-1 < (char)(bVar6 << ((byte)uVar12 & 0x1f))) {
        __assert_fail("hash[j - 1] & (LYB_HASH_COLLISION_ID >> (j - 1))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                      ,0x3a0,
                      "int lyb_parse_schema_hash(const struct lys_node *, const struct lys_module *, const char *, const char *, int, struct lys_node **, struct lyb_state *)"
                     );
      }
      if ((bVar6 >> (9U - (char)uVar7 & 0x1f) & 0x7f) != 0) {
        __assert_fail("!(hash[j - 1] & (LYB_HASH_MASK << (LYB_HASH_BITS - (j - 1))))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                      ,0x3a2,
                      "int lyb_parse_schema_hash(const struct lys_node *, const struct lys_module *, const char *, const char *, int, struct lys_node **, struct lyb_state *)"
                     );
      }
      uVar1 = uVar1 + uVar2;
      pcVar9 = pcVar9 + uVar2;
      bVar6 = (char)uVar7 - 1;
      uVar7 = (ulong)bVar6;
    } while (bVar6 != 0);
    lVar11 = uVar5 + 2;
    mod = plStack_40;
  }
  plStack_40 = mod;
  if (((mod == (lys_module *)0x0) || (yang_data_name == (char *)0x0)) ||
     ((options & 0x1000000U) == 0)) {
    if (sparent != (lys_node *)0x0) goto LAB_00144a24;
    last = (lys_node *)0x0;
LAB_00144a8a:
    mod = plStack_40;
    sibling = lys_getnext((lys_node *)0x0,last,plStack_40,0);
    sparent = last;
    plVar13 = (lys_node *)0x0;
    if (sibling == (lys_node *)0x0) goto LAB_00144afd;
    do {
      iVar3 = lyb_has_schema_model(sibling,lybs->models,lybs->mod_count);
      if (iVar3 != 0) {
        lVar8 = 0;
        while (bVar6 = lyb_hash(sibling,(uint8_t)lVar8), bVar6 == local_47[lVar8]) {
          lVar8 = lVar8 + 1;
          mod = plStack_40;
          plVar13 = sibling;
          if (lVar11 == lVar8) goto LAB_00144afd;
        }
      }
      mod = plStack_40;
      sibling = lys_getnext(sibling,last,plStack_40,0);
    } while (sibling != (lys_node *)0x0);
  }
  else {
    sVar4 = strlen(yang_data_name);
    sparent = lyp_get_yang_data_template(mod,yang_data_name,(int)sVar4);
    if (sparent != (lys_node *)0x0) {
LAB_00144a24:
      last = sparent;
      if ((sparent->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
        last = (lys_node *)0x0;
        do {
          last = lys_getnext(last,sparent,(lys_module *)0x0,8);
          mod = plStack_40;
          plVar13 = (lys_node *)0x0;
          if (last == (lys_node *)0x0) goto LAB_00144afd;
        } while ((((byte)options >> 4 & last->nodetype == LYS_INPUT) == 0) &&
                ((options & 0x20U) == 0 || last->nodetype != LYS_OUTPUT));
      }
      goto LAB_00144a8a;
    }
    last = (lys_node *)0x0;
  }
  sparent = last;
  plVar13 = (lys_node *)0x0;
LAB_00144afd:
  *snode = plVar13;
  if ((((uint)options >> 9 & 1) != 0) && (plVar13 == (lys_node *)0x0)) {
    if (mod == (lys_module *)0x0) {
      pcVar9 = sparent->name;
      pcVar10 = "Failed to find matching hash for a child of \"%s\".";
      elem_type = LY_VLOG_LYS;
    }
    else {
      pcVar9 = mod->name;
      pcVar10 = "Failed to find matching hash for a top-level node from \"%s\".";
      elem_type = LY_VLOG_NONE;
      sparent = (lys_node *)0x0;
    }
    uVar1 = 0xffffffff;
    ly_vlog(lybs->ctx,LYE_SPEC,elem_type,sparent,pcVar10,pcVar9);
  }
  return uVar1;
}

Assistant:

static int
lyb_parse_schema_hash(const struct lys_node *sparent, const struct lys_module *mod, const char *data, const char *yang_data_name,
                      int options, struct lys_node **snode, struct lyb_state *lybs)
{
    int r, ret = 0;
    uint8_t i, j;
    struct lys_node *sibling;
    LYB_HASH hash[LYB_HASH_BITS - 1];

    assert((sparent || mod) && (!sparent || !mod));

    /* read the first hash */
    ret += (r = lyb_read(data, &hash[0], sizeof *hash, lybs));
    LYB_HAVE_READ_RETURN(r, data, -1);

    /* based on the first hash read all the other ones, if any */
    for (i = 0; !(hash[0] & (LYB_HASH_COLLISION_ID >> i)); ++i) {
        if (i > LYB_HASH_BITS) {
            return -1;
        }
    }

    /* move the first hash on its accurate position */
    hash[i] = hash[0];

    /* read the rest of hashes */
    for (j = i; j; --j) {
        ret += (r = lyb_read(data, &hash[j - 1], sizeof *hash, lybs));
        LYB_HAVE_READ_RETURN(r, data, -1);

        /* correct collision ID */
        assert(hash[j - 1] & (LYB_HASH_COLLISION_ID >> (j - 1)));
        /* preceded with zeros */
        assert(!(hash[j - 1] & (LYB_HASH_MASK << (LYB_HASH_BITS - (j - 1)))));
    }

    /* handle yang data templates */
    if ((options & LYD_OPT_DATA_TEMPLATE) && yang_data_name && mod) {
        sparent = lyp_get_yang_data_template(mod, yang_data_name, strlen(yang_data_name));
        if (!sparent) {
            sibling = NULL;
            goto finish;
        }
    }

    /* handle RPC/action input/output */
    if (sparent && (sparent->nodetype & (LYS_RPC | LYS_ACTION))) {
        sibling = NULL;
        while ((sibling = (struct lys_node *)lys_getnext(sibling, sparent, NULL, LYS_GETNEXT_WITHINOUT))) {
            if ((sibling->nodetype == LYS_INPUT) && (options & LYD_OPT_RPC)) {
                break;
            }
            if ((sibling->nodetype == LYS_OUTPUT) && (options & LYD_OPT_RPCREPLY)) {
                break;
            }
        }
        if (!sibling) {
            /* fail */
            goto finish;
        }

        /* use only input/output children nodes */
        sparent = sibling;
    }

    /* find our node with matching hashes */
    sibling = NULL;
    while ((sibling = (struct lys_node *)lys_getnext(sibling, sparent, mod, 0))) {
        /* skip schema nodes from models not present during printing */
        if (lyb_has_schema_model(sibling, lybs->models, lybs->mod_count) && lyb_is_schema_hash_match(sibling, hash, i + 1)) {
            /* match found */
            break;
        }
    }

finish:
    *snode = sibling;
    if (!sibling && (options & LYD_OPT_STRICT)) {
        if (mod) {
            LOGVAL(lybs->ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Failed to find matching hash for a top-level node from \"%s\".",
                    mod->name);
        } else {
            LOGVAL(lybs->ctx, LYE_SPEC, LY_VLOG_LYS, sparent, "Failed to find matching hash for a child of \"%s\".",
                    sparent->name);
        }
        return -1;
    }

    return ret;
}